

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O3

TestCaseGroup * vkt::pipeline::createImageTests(TestContext *testCtx)

{
  ulong uVar1;
  _Alloc_hider name;
  bool bVar2;
  undefined8 *puVar3;
  long *plVar4;
  TestNode *pTVar5;
  TestNode *this;
  TestNode *node;
  ostream *poVar6;
  long lVar7;
  void *pvVar8;
  char *pcVar9;
  long *plVar10;
  char *pcVar11;
  int *piVar12;
  int iVar13;
  undefined8 unaff_RBP;
  int *piVar14;
  void *pvVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  ulong uVar17;
  vector<int,_std::allocator<int>_> arraySizes;
  vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> imageSizes;
  string fullName;
  ostringstream caseName;
  vector<int,_std::allocator<int>_> local_428;
  TestContext *local_410;
  void *local_408;
  void *pvStack_400;
  long local_3f8;
  string local_3f0;
  VkFormat local_3d0;
  allocator<char> local_3c9;
  ulong local_3c8;
  TestNode *local_3c0;
  TestNode *local_3b8;
  TestNode *local_3b0;
  TestNode *local_3a8;
  TestNode *local_3a0;
  TestNode *local_398;
  TestNode *local_390;
  long local_388;
  long local_380;
  ulong local_378;
  uint local_36c;
  Precision local_368;
  int local_364;
  long *local_360 [2];
  long local_350 [2];
  long local_340;
  undefined1 local_338 [16];
  long local_328;
  long lStack_320;
  ios_base local_2c8 [264];
  long local_1c0;
  _func_int **local_1b8;
  ulong local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_390 = (TestNode *)operator_new(0x70);
  local_410 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_390,testCtx,"image","Image tests");
  local_3b8 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_3b8,local_410,"sampling_type","");
  uVar17 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  local_1b8 = (_func_int **)&PTR__TestCase_00d20790;
  lVar7 = 0;
  do {
    pcVar11 = "separate";
    if ((char)uVar17 != '\0') {
      pcVar11 = "combined";
    }
    local_3a8 = (TestNode *)operator_new(0x70);
    local_3f0.field_2._M_local_buf[0] = 'U';
    local_3f0.field_2._M_allocated_capacity._1_2_ = 0x6573;
    local_3f0.field_2._M_allocated_capacity._3_4_ = 0x20612073;
    local_3f0._M_string_length = 7;
    local_3f0.field_2._M_local_buf[7] = '\0';
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
    pcVar9 = (char *)(puVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar9) {
      local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar9;
      local_1a8[0].field_2._8_8_ = puVar3[3];
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    }
    else {
      local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar9;
      local_1a8[0]._M_dataplus._M_p = (pointer)*puVar3;
    }
    local_1a8[0]._M_string_length = puVar3[1];
    *puVar3 = pcVar9;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)local_1a8);
    local_338._0_8_ = &local_328;
    plVar10 = plVar4 + 2;
    if ((long *)*plVar4 == plVar10) {
      local_328 = *plVar10;
      lStack_320 = plVar4[3];
    }
    else {
      local_328 = *plVar10;
      local_338._0_8_ = (long *)*plVar4;
    }
    local_338._8_8_ = plVar4[1];
    *plVar4 = (long)plVar10;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)local_3a8,local_410,pcVar11,(char *)local_338._0_8_);
    if ((long *)local_338._0_8_ != &local_328) {
      operator_delete((void *)local_338._0_8_,local_328 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT17(local_3f0.field_2._M_local_buf[7],
                               CONCAT43(local_3f0.field_2._M_allocated_capacity._3_4_,
                                        CONCAT21(local_3f0.field_2._M_allocated_capacity._1_2_,
                                                 local_3f0.field_2._M_local_buf[0]))) + 1);
    }
    local_368 = vkt::sr::anon_unknown_0::ShaderMatrixTests::init::precisions[lVar7];
    local_3b0 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)local_3b0,local_410,"view_type","");
    lVar7 = 0;
    local_36c = (uint)uVar17;
    do {
      local_3c8 = (ulong)(uint)(&DAT_00d277b0)[lVar7 * 4];
      local_1c0 = lVar7;
      local_3a0 = (TestNode *)operator_new(0x70);
      pcVar11 = (char *)(&DAT_00d277b8)[lVar7 * 2];
      local_3f0.field_2._M_local_buf[0] = 'U';
      local_3f0.field_2._M_allocated_capacity._1_2_ = 0x6573;
      local_3f0.field_2._M_allocated_capacity._3_4_ = 0x20612073;
      local_3f0._M_string_length = 7;
      local_3f0.field_2._M_local_buf[7] = '\0';
      local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
      puVar3 = (undefined8 *)std::__cxx11::string::append((char *)&local_3f0);
      pcVar9 = (char *)(puVar3 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar3 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar9) {
        local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar9;
        local_1a8[0].field_2._8_8_ = puVar3[3];
        local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      }
      else {
        local_1a8[0].field_2._0_8_ = *(undefined8 *)pcVar9;
        local_1a8[0]._M_dataplus._M_p = (pointer)*puVar3;
      }
      local_1a8[0]._M_string_length = puVar3[1];
      *puVar3 = pcVar9;
      puVar3[1] = 0;
      *(undefined1 *)(puVar3 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)local_1a8);
      plVar10 = plVar4 + 2;
      if ((long *)*plVar4 == plVar10) {
        local_328 = *plVar10;
        lStack_320 = plVar4[3];
        local_338._0_8_ = &local_328;
      }
      else {
        local_328 = *plVar10;
        local_338._0_8_ = (long *)*plVar4;
      }
      local_338._8_8_ = plVar4[1];
      *plVar4 = (long)plVar10;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_3a0,local_410,pcVar11,(char *)local_338._0_8_);
      if ((long *)local_338._0_8_ != &local_328) {
        operator_delete((void *)local_338._0_8_,local_328 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
        operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1
                       );
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
        operator_delete(local_3f0._M_dataplus._M_p,
                        CONCAT17(local_3f0.field_2._M_local_buf[7],
                                 CONCAT43(local_3f0.field_2._M_allocated_capacity._3_4_,
                                          CONCAT21(local_3f0.field_2._M_allocated_capacity._1_2_,
                                                   local_3f0.field_2._M_local_buf[0]))) + 1);
      }
      local_398 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)local_398,local_410,"format","Tests samplable formats");
      local_388 = 0;
      do {
        paVar16 = &local_1a8[0].field_2;
        local_3d0 = *(VkFormat *)(&DAT_00ae0790 + local_388 * 4);
        bVar2 = ::vk::isCompressedFormat(local_3d0);
        if ((local_3c8 & 0xfffffffb) == 0 && bVar2) break;
        local_3c0 = (TestNode *)operator_new(0x70);
        pcVar11 = ::vk::getFormatName(local_3d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_338,pcVar11,(allocator<char> *)local_1a8);
        std::__cxx11::string::substr((ulong)local_1a8,(ulong)local_338);
        de::toLower(&local_3f0,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar16) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((long *)local_338._0_8_ != &local_328) {
          operator_delete((void *)local_338._0_8_,local_328 + 1);
        }
        name._M_p = local_3f0._M_dataplus._M_p;
        local_360[0] = (long *)0x1c;
        local_1a8[0]._M_dataplus._M_p = (pointer)paVar16;
        local_1a8[0]._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)local_1a8,(ulong)local_360);
        local_1a8[0].field_2._M_allocated_capacity = local_360[0];
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xc) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xe) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xf) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x10) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x11) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x12) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x13) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x14) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x15) = 'f';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x16) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x17) = 'r';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x18) = 'm';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x19) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x1a) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0x1b) = ' ';
        *(undefined8 *)local_1a8[0]._M_dataplus._M_p = 0x2073656c706d6153;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 8) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 9) = ' ';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 10) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xb) = 'e';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xc) = 'x';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xd) = 't';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xe) = 'u';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8[0]._M_dataplus._M_p + 0xf) = 'r';
        local_1a8[0]._M_string_length = (size_type)local_360[0];
        local_1a8[0]._M_dataplus._M_p[(long)local_360[0]] = '\0';
        ::vk::getFormatName(local_3d0);
        plVar4 = (long *)std::__cxx11::string::append((char *)local_1a8);
        plVar10 = plVar4 + 2;
        if ((long *)*plVar4 == plVar10) {
          local_328 = *plVar10;
          lStack_320 = plVar4[3];
          local_338._0_8_ = &local_328;
        }
        else {
          local_328 = *plVar10;
          local_338._0_8_ = (long *)*plVar4;
        }
        local_338._8_8_ = plVar4[1];
        *plVar4 = (long)plVar10;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        tcu::TestCaseGroup::TestCaseGroup
                  ((TestCaseGroup *)local_3c0,local_410,name._M_p,(char *)local_338._0_8_);
        if ((long *)local_338._0_8_ != &local_328) {
          operator_delete((void *)local_338._0_8_,local_328 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar16) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
          operator_delete(local_3f0._M_dataplus._M_p,
                          CONCAT17(local_3f0.field_2._M_local_buf[7],
                                   CONCAT43(local_3f0.field_2._M_allocated_capacity._3_4_,
                                            CONCAT21(local_3f0.field_2._M_allocated_capacity._1_2_,
                                                     local_3f0.field_2._M_local_buf[0]))) + 1);
        }
        local_380 = 0;
        do {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"count_",6);
          lVar7 = local_380;
          local_364 = *(int *)(&DAT_00ae0964 + local_380 * 4);
          std::ostream::operator<<(local_1a8,local_364);
          pTVar5 = (TestNode *)operator_new(0x70);
          std::__cxx11::stringbuf::str();
          tcu::TestCaseGroup::TestCaseGroup
                    ((TestCaseGroup *)pTVar5,local_410,(char *)local_338._0_8_,"");
          if ((long *)local_338._0_8_ != &local_328) {
            operator_delete((void *)local_338._0_8_,local_328 + 1);
          }
          local_3f8 = 0;
          local_408 = (void *)0x0;
          pvStack_400 = (void *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage = (int *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start = (int *)0x0;
          local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = (int *)0x0;
          this = (TestNode *)operator_new(0x70);
          tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)this,local_410,"size","");
          switch(local_3c8 & 0xffffffff) {
          case 0:
          case 4:
            if (lVar7 == 0) {
              local_338._0_4_ = 1;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 2;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0x20;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0x80;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_4_ = 0x200;
            local_338._4_4_ = 1;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            if (lVar7 == 0) {
              local_338._0_4_ = 3;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0xd;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0x7f;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_8_ = (long *)0x1000001bb;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            break;
          case 1:
          case 5:
            if (lVar7 == 0) {
              local_338._0_4_ = 1;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 2;
              local_338._4_4_ = 2;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0x20;
              local_338._4_4_ = 0x20;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 3;
              local_338._4_4_ = 3;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 0xd;
              local_338._4_4_ = 0xd;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 8;
              local_338._4_4_ = 0x10;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_4_ = 0x20;
            local_338._4_4_ = 0x10;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            local_338._0_8_ = (long *)0x170000000d;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            if (lVar7 == 0) {
              local_338._0_8_ = (long *)0x800000017;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            break;
          case 2:
            if (lVar7 == 0) {
              local_338._0_4_ = 1;
              local_338._4_4_ = 1;
              local_338._8_4_ = 1;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 2;
              local_338._4_4_ = 2;
              local_338._8_4_ = 2;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_4_ = 0x10;
            local_338._4_4_ = 0x10;
            local_338._8_4_ = 0x10;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            if (lVar7 == 0) {
              local_338._0_4_ = 3;
              local_338._4_4_ = 3;
              local_338._8_4_ = 3;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
              local_338._0_4_ = 5;
              local_338._4_4_ = 5;
              local_338._8_4_ = 5;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_4_ = 0xb;
            local_338._4_4_ = 0xb;
            local_338._8_4_ = 0xb;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            if (lVar7 == 0) {
              local_338._0_4_ = 0x20;
              local_338._4_4_ = 0x10;
              local_338._8_4_ = 8;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            local_338._0_4_ = 8;
            local_338._4_4_ = 0x10;
            local_338._8_4_ = 0x20;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            local_338._0_8_ = (long *)0xb00000011;
            local_338._8_4_ = 5;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            if (lVar7 == 0) {
              local_338._0_8_ = (long *)0xb00000005;
              local_338._8_4_ = 0x11;
              std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
              emplace_back<tcu::Vector<int,3>>
                        ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408
                         ,(Vector<int,_3> *)local_338);
            }
            goto switchD_004a93c5_default;
          case 3:
          case 6:
            local_338._0_4_ = 0x20;
            local_338._4_4_ = 0x20;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            local_338._0_8_ = (long *)0xd0000000d;
            local_338._8_4_ = 1;
            std::vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>>::
            emplace_back<tcu::Vector<int,3>>
                      ((vector<tcu::Vector<int,3>,std::allocator<tcu::Vector<int,3>>> *)&local_408,
                       (Vector<int,_3> *)local_338);
            break;
          default:
            goto switchD_004a93c5_default;
          }
          iVar13 = (int)local_3c8;
          if (iVar13 - 4U < 2) {
            if (lVar7 == 0) {
              local_338._0_4_ = 3;
              if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_428,
                           (iterator)
                           local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_338);
              }
              else {
                *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 3;
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            local_338._0_4_ = 6;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
LAB_004a9a21:
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 6;
              goto LAB_004a9a69;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_338);
          }
          else if (iVar13 == 3) {
            local_338._0_4_ = 6;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) goto LAB_004a9a21;
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_338);
          }
          else if (iVar13 == 6) {
            if (lVar7 == 0) {
              local_338._0_4_ = 6;
              if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_428,
                           (iterator)
                           local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)local_338);
              }
              else {
                *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 6;
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
            }
            local_338._0_4_ = 0x24;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_428,
                         (iterator)
                         local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,(int *)local_338);
            }
            else {
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 0x24;
LAB_004a9a69:
              local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          else {
switchD_004a93c5_default:
            local_338._0_4_ = 1;
            if (local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              *local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = 1;
              goto LAB_004a9a69;
            }
            std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                      (&local_428,
                       (iterator)
                       local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_338);
          }
          piVar14 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pvVar15 = local_408;
          if (pvStack_400 != local_408) {
            local_340 = 0;
            local_378 = 0;
            pvVar8 = pvStack_400;
            piVar12 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            do {
              bVar2 = piVar12 != piVar14;
              piVar12 = piVar14;
              if (bVar2) {
                uVar17 = 0;
                do {
                  node = (TestNode *)operator_new(0x90);
                  piVar12 = (int *)(local_378 * 0xc + (long)local_408);
                  iVar13 = piVar14[uVar17];
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_338);
                  if ((uint)local_3c8 < 7) {
                    if ((0xbU >> ((uint)local_3c8 & 0x1f) & 1) == 0) {
                      if ((0x70U >> ((uint)local_3c8 & 0x1f) & 1) == 0) {
                        poVar6 = (ostream *)std::ostream::operator<<(local_338,*piVar12);
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
                        poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar12[1]);
                        lVar7 = 8;
                        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
                        goto LAB_004a9bc2;
                      }
                      poVar6 = (ostream *)std::ostream::operator<<(local_338,*piVar12);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
                      poVar6 = (ostream *)std::ostream::operator<<(poVar6,piVar12[1]);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"_array_of_",10);
                    }
                    else {
                      poVar6 = (ostream *)std::ostream::operator<<(local_338,*piVar12);
                      lVar7 = 4;
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"x",1);
LAB_004a9bc2:
                      iVar13 = *(int *)((long)piVar12 + lVar7);
                    }
                    std::ostream::operator<<(poVar6,iVar13);
                  }
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_338);
                  std::ios_base::~ios_base(local_2c8);
                  pvVar15 = local_408;
                  iVar13 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar17];
                  local_1b0 = uVar17;
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)local_338,(char *)local_360[0],&local_3c9);
                  paVar16 = &local_3f0.field_2;
                  local_3f0._M_string_length = 0;
                  local_3f0.field_2._M_local_buf[0] = '\0';
                  local_3f0._M_dataplus._M_p = (pointer)paVar16;
                  tcu::TestCase::TestCase
                            ((TestCase *)node,local_410,(char *)local_338._0_8_,
                             paVar16->_M_local_buf);
                  node->_vptr_TestNode = local_1b8;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_3f0._M_dataplus._M_p != paVar16) {
                    operator_delete(local_3f0._M_dataplus._M_p,
                                    CONCAT17(local_3f0.field_2._M_local_buf[7],
                                             CONCAT43(local_3f0.field_2._M_allocated_capacity._3_4_,
                                                      CONCAT21(local_3f0.field_2.
                                                               _M_allocated_capacity._1_2_,
                                                               local_3f0.field_2._M_local_buf[0])))
                                    + 1);
                  }
                  if ((long *)local_338._0_8_ != &local_328) {
                    operator_delete((void *)local_338._0_8_,local_328 + 1);
                  }
                  node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d27830;
                  *(Precision *)&node[1]._vptr_TestNode = local_368;
                  *(int *)((long)&node[1]._vptr_TestNode + 4) = (int)local_3c8;
                  *(VkFormat *)&node[1].m_testCtx = local_3d0;
                  lVar7 = 0;
                  do {
                    *(undefined4 *)((long)&node[1].m_testCtx + lVar7 * 4 + 4) =
                         *(undefined4 *)((long)pvVar15 + lVar7 * 4 + local_340);
                    lVar7 = lVar7 + 1;
                  } while (lVar7 != 3);
                  *(int *)&node[1].m_name._M_string_length = local_364;
                  *(int *)((long)&node[1].m_name._M_string_length + 4) = iVar13;
                  tcu::TestNode::addChild(this,node);
                  if (local_360[0] != local_350) {
                    operator_delete(local_360[0],local_350[0] + 1);
                  }
                  uVar17 = local_1b0 + 1;
                  pvVar8 = pvStack_400;
                  piVar12 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish;
                  piVar14 = local_428.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pvVar15 = local_408;
                } while (uVar17 < (ulong)((long)local_428.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_428.
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data._M_start >> 2));
              }
              local_378 = local_378 + 1;
              local_340 = local_340 + 0xc;
            } while (local_378 < (ulong)(((long)pvVar8 - (long)pvVar15 >> 2) * -0x5555555555555555))
            ;
          }
          if (piVar14 != (int *)0x0) {
            operator_delete(piVar14,(long)local_428.super__Vector_base<int,_std::allocator<int>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)piVar14);
            pvVar15 = local_408;
          }
          if (pvVar15 != (void *)0x0) {
            operator_delete(pvVar15,local_3f8 - (long)pvVar15);
          }
          tcu::TestNode::addChild(pTVar5,this);
          uVar17 = (ulong)local_36c;
          tcu::TestNode::addChild(local_3c0,pTVar5);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          local_380 = local_380 + 1;
        } while (local_380 != 3);
        tcu::TestNode::addChild(local_398,local_3c0);
        local_388 = local_388 + 1;
      } while (local_388 != 0x75);
      pTVar5 = local_3a0;
      tcu::TestNode::addChild(local_3a0,local_398);
      tcu::TestNode::addChild(local_3b0,pTVar5);
      pTVar5 = local_3a8;
      lVar7 = local_1c0 + 1;
    } while (lVar7 != 7);
    tcu::TestNode::addChild(local_3a8,local_3b0);
    tcu::TestNode::addChild(local_3b8,pTVar5);
    pTVar5 = local_390;
    lVar7 = 1;
    uVar1 = uVar17 & 1;
    uVar17 = 0;
    if (uVar1 == 0) {
      tcu::TestNode::addChild(local_390,local_3b8);
      return (TestCaseGroup *)pTVar5;
    }
  } while( true );
}

Assistant:

tcu::TestCaseGroup* createImageTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> imageTests(new tcu::TestCaseGroup(testCtx, "image", "Image tests"));
	de::MovePtr<tcu::TestCaseGroup> samplingTypeTests = createImageSamplingTypeTests(testCtx);

	imageTests->addChild(samplingTypeTests.release());

	return imageTests.release();
}